

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void run_test(wstring_view *text,value *expected)

{
  _Head_base<0UL,_mjs::block_statement_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  wostream *pwVar4;
  value *v;
  value *v_00;
  int iVar5;
  _Head_base<0UL,_mjs::block_statement_*,_false> local_290;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_278;
  interpreter i;
  value res;
  anon_class_24_3_46a01442 pb;
  gc_heap h;
  wostringstream error_stream;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188 [46];
  
  if (((run_test_func == (char *)0x0) || (run_test_file == (char *)0x0)) || (run_test_line == 0)) {
    __assert_fail("run_test_func && run_test_file && run_test_line",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x1a
                  ,"void run_test(const std::wstring_view &, const value &)");
  }
  mjs::gc_heap::gc_heap(&h,run_test::storage,0x200000);
  local_290._M_head_impl = (block_statement *)0x0;
  local_288._0_4_ = tested_version_;
  std::
  make_shared<mjs::source_file,wchar_t_const(&)[5],std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,mjs::version>
            ((wchar_t (*) [5])&error_stream,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)L"test",(version *)text);
  mjs::parse((mjs *)&res,(shared_ptr<mjs::source_file> *)&error_stream,non_strict);
  uVar2 = res._0_8_;
  _Var1._M_head_impl = local_290._M_head_impl;
  res.type_ = undefined;
  res._4_4_ = 0;
  local_290._M_head_impl = (block_statement *)uVar2;
  if (_Var1._M_head_impl != (block_statement *)0x0) {
    (*((_Var1._M_head_impl)->super_statement).super_syntax_node._vptr_syntax_node[1])();
    if (res._0_8_ != 0) {
      (**(code **)(*(long *)res._0_8_ + 8))();
    }
  }
  res.type_ = undefined;
  res._4_4_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_188);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&error_stream);
  pb.bs = (unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> *)&local_290
  ;
  res._0_8_ = res._0_8_ & 0xffffffff00000000;
  local_278._M_allocated_capacity = 0;
  local_278._8_8_ = (gc_heap *)0x0;
  local_288._0_8_ = (void *)0x0;
  local_288._8_8_ = (impl *)0x0;
  pb.error_stream = &error_stream;
  pb.text = text;
  mjs::interpreter::interpreter(&i,&h,tested_version_,(on_statement_executed_type *)local_288);
  std::_Function_base::~_Function_base((_Function_base *)local_288);
  mjs::interpreter::eval((value *)local_288,&i,&(local_290._M_head_impl)->super_statement);
  mjs::value::operator=(&res,(value *)local_288);
  mjs::value::~value((value *)local_288);
  mjs::interpreter::~interpreter(&i);
  bVar3 = mjs::operator!=(&res,expected);
  if (!bVar3) {
    mjs::value::~value(&res);
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&error_stream);
    if (local_290._M_head_impl != (block_statement *)0x0) {
      (*((local_290._M_head_impl)->super_statement).super_syntax_node._vptr_syntax_node[1])();
    }
    mjs::gc_heap::garbage_collect(&h);
    iVar5 = (int)(((ulong)(h.alloc_context_.next_free_ - h.alloc_context_.start_) * 100) /
                 (ulong)(h.alloc_context_.capacity_ - h.alloc_context_.start_));
    if (iVar5 == 0) {
      mjs::gc_heap::~gc_heap(&h);
      return;
    }
    pwVar4 = std::operator<<((wostream *)&std::wcout,"Leaks! Used now: ");
    std::wostream::operator<<((wostream *)pwVar4,iVar5);
    _error_stream = 5;
    local_188[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1788cc;
    mjs::throw_runtime_error
              ((string_view *)&error_stream,
               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x5e);
  }
  run_test::anon_class_24_3_46a01442::operator()(&pb);
  pwVar4 = std::operator<<((wostream *)&error_stream,"Expecting ");
  mjs::debug_string_abi_cxx11_((wstring *)local_288,(mjs *)expected,v);
  pwVar4 = std::operator<<(pwVar4,(wstring *)local_288);
  pwVar4 = std::operator<<(pwVar4," got ");
  mjs::debug_string_abi_cxx11_((wstring *)&i,(mjs *)&res,v_00);
  pwVar4 = std::operator<<(pwVar4,(wstring *)&i);
  std::operator<<(pwVar4,"\n");
  std::__cxx11::wstring::~wstring((wstring *)&i);
  std::__cxx11::wstring::~wstring((wstring *)local_288);
  std::__cxx11::wstringbuf::str();
  i.impl_._M_t.
  super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>._M_t.
  super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>.
  super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl =
       (unique_ptr<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>)
       (unique_ptr<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>)
       local_288._8_8_;
  mjs::throw_runtime_error
            ((wstring_view *)&i,
             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x56);
}

Assistant:

void run_test(const std::wstring_view& text, const value& expected) {
    assert(run_test_func && run_test_file && run_test_line);

    // Use local heap, even if expected lives in another heap
    constexpr uint32_t num_slots = 1<<21;
#ifndef MJS_GC_STRESS_TEST
    // Re-use storage unless we're stress testing
    static uint64_t storage[num_slots];
    gc_heap h{storage, num_slots};
#else
    gc_heap h{num_slots};
#endif

    {
        decltype(parse(nullptr)) bs;
        try {
            bs = parse(std::make_shared<source_file>(L"test", text, tested_version()));
        } catch (const std::exception& e) {
            std::wcout << "Parse failed for \"" << text << "\": " << e.what() <<  "\n";
            throw;
        }
        std::wostringstream error_stream;
        auto pb = [&]() {
            const char * start = "----------------\n";
            const char * end = "----------------\n\n";

            error_stream << "\n";
            error_stream << run_test_file << ":" << run_test_line << " in " << run_test_func << ":\n";

            error_stream << "Test failure in:\n";
            error_stream << start;
            error_stream << text << "\n";
            error_stream << end;

            error_stream << "Parsed as:\n";
            error_stream << start;
            for (const auto& s: bs->l()) {
                error_stream << *s << "\n\n";
            }
            error_stream << end;

            error_stream << "Pretty printed:\n";
            error_stream << start;
            print(error_stream, *bs);
            error_stream << "\n";
            error_stream << end;

            error_stream << "\n";
        };
        value res;
        try {
            interpreter i{h, tested_version()};
            res = i.eval(*bs);
        } catch (const std::exception& e) {
            pb();
            error_stream << "Unexpected exception thrown: " << e.what() << "\n";
            THROW_RUNTIME_ERROR(error_stream.str());
        }
        if (res != expected) {
            pb();
            error_stream << "Expecting " << debug_string(expected) << " got " << debug_string(res) << "\n";
            THROW_RUNTIME_ERROR(error_stream.str());
        }
    }

    h.garbage_collect();
    const auto used_now = h.use_percentage();
    if (used_now) {
        std::wcout << "Leaks! Used now: " << used_now;
        THROW_RUNTIME_ERROR("Leaks");
    }
}